

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

int * __thiscall ring_buffer<int>::rat(ring_buffer<int> *this,size_t i)

{
  runtime_error *this_00;
  const_reference pvVar1;
  ulong in_RSI;
  ulong *in_RDI;
  
  if (in_RDI[1] <= in_RSI) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"ring buffer: index out of bounds");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),
                      (((in_RDI[2] + in_RDI[1]) - in_RSI) - 1) % *in_RDI);
  return pvVar1;
}

Assistant:

const T & rat(size_t i) const {
        if (i >= sz) {
            throw std::runtime_error("ring buffer: index out of bounds");
        }
        return data[(first + sz - i - 1) % capacity];
    }